

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomUpEvaluation.hpp
# Opt level: O0

TermList __thiscall
Lib::
BottomUpEvaluation<Kernel::PolyNf,_Kernel::TermList,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/PolynomialNormalizer.cpp:393:9),_Lib::ReturnNone<Kernel::TermList>,_MemoNonVars<Kernel::PolyNf,_Kernel::TermList>_&,_std::tuple<>_>
::apply(BottomUpEvaluation<Kernel::PolyNf,_Kernel::TermList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_PolynomialNormalizer_cpp:393:9),_Lib::ReturnNone<Kernel::TermList>,_MemoNonVars<Kernel::PolyNf,_Kernel::TermList>_&,_std::tuple<>_>
        *this,PolyNf *toEval)

{
  anon_class_24_3_9e03d13b init;
  bool bVar1;
  uint uVar2;
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *pSVar3;
  BottomUpChildIter<Kernel::PolyNf> *pBVar4;
  TermList *pTVar5;
  size_t sVar6;
  Stack<Kernel::TermList> *pSVar7;
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *in_RDI;
  TermList eval;
  TermList *argLst;
  BottomUpChildIter<Kernel::PolyNf> orig;
  Option<Kernel::TermList> cached;
  Option<Kernel::TermList> nonRec;
  PolyNf t;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> recResults;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  recState;
  TermList result;
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *in_stack_fffffffffffffd28;
  TermList in_stack_fffffffffffffd30;
  ReturnNone<Kernel::TermList> *in_stack_fffffffffffffd38;
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *in_stack_fffffffffffffd40;
  MemoNonVars<Kernel::PolyNf,_Kernel::TermList> *in_stack_fffffffffffffd48;
  TermList in_stack_fffffffffffffd70;
  PolyNf *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  Stack<Kernel::TermList> *in_stack_fffffffffffffda0;
  PolyNf *pPVar8;
  undefined4 in_stack_fffffffffffffdb0;
  BottomUpChildIter<Kernel::PolyNf> local_180;
  PolyNf *local_158;
  BottomUpChildIter<Kernel::PolyNf> local_14c;
  undefined1 local_124 [24];
  BottomUpChildIter<Kernel::PolyNf> local_10c;
  uint64_t local_e8;
  OptionBase<Kernel::TermList> local_e0;
  uint64_t local_d0;
  BottomUpChildIter<Kernel::PolyNf> local_9c;
  BottomUpChildIter<Kernel::PolyNf> local_68 [2];
  uint64_t local_8;
  
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_fffffffffffffd30._content);
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffd30._content);
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x918010);
  Kernel::PolyNf::PolyNf
            ((PolyNf *)in_stack_fffffffffffffd30._content,(PolyNf *)in_stack_fffffffffffffd28);
  BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter
            (local_68,(char *)((long)local_9c._self._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
                                     .
                                     super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                                     ._content + 0x1b));
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::push
            (in_stack_fffffffffffffd40,
             (BottomUpChildIter<Kernel::PolyNf> *)in_stack_fffffffffffffd38);
  while( true ) {
    pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x91806e);
    bVar1 = Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::isEmpty(pSVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x9180ad);
    pBVar4 = Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::top(pSVar3);
    bVar1 = BottomUpChildIter<Kernel::PolyNf>::hasNext(pBVar4);
    if (bVar1) {
      pSVar3 = Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x918101);
      pBVar4 = Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::top(pSVar3);
      BottomUpChildIter<Kernel::PolyNf>::next(&local_9c,pBVar4);
      Kernel::PolyNf::PolyNf
                ((PolyNf *)in_stack_fffffffffffffd30._content,(PolyNf *)in_stack_fffffffffffffd28);
      ReturnNone<Kernel::TermList>::operator()
                (in_stack_fffffffffffffd38,(PolyNf *)in_stack_fffffffffffffd30._content);
      bVar1 = Lib::Option::operator_cast_to_bool((Option<Kernel::TermList> *)0x918190);
      if (bVar1) {
        Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x9181b6);
        pTVar5 = Option<Kernel::TermList>::operator*((Option<Kernel::TermList> *)0x9181cd);
        local_d0 = (uint64_t)move_if_value<Kernel::TermList,_true>(pTVar5);
        Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
      }
      else {
        MemoNonVars<Kernel::PolyNf,_Kernel::TermList>::get
                  (in_stack_fffffffffffffd48,(PolyNf *)in_stack_fffffffffffffd40);
        bVar1 = OptionBase<Kernel::TermList>::isSome(&local_e0);
        if (bVar1) {
          Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0x9182bb);
          pTVar5 = OptionBase<Kernel::TermList>::unwrap((OptionBase<Kernel::TermList> *)0x9182d2);
          local_e8 = pTVar5->_content;
          Stack<Kernel::TermList>::push
                    ((Stack<Kernel::TermList> *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd30)
          ;
        }
        else {
          Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x91833b);
          Kernel::PolyNf::PolyNf
                    ((PolyNf *)in_stack_fffffffffffffd30._content,
                     (PolyNf *)in_stack_fffffffffffffd28);
          BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(&local_10c,local_124);
          Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::push
                    (in_stack_fffffffffffffd40,
                     (BottomUpChildIter<Kernel::PolyNf> *)in_stack_fffffffffffffd38);
        }
        Option<Kernel::TermList>::~Option((Option<Kernel::TermList> *)0x918399);
      }
      Option<Kernel::TermList>::~Option((Option<Kernel::TermList> *)0x9183a6);
    }
    else {
      Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator->((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x9183ca);
      Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::pop(in_stack_fffffffffffffd28);
      uVar2 = BottomUpChildIter<Kernel::PolyNf>::nChildren(&local_14c);
      if (uVar2 == 0) {
        pPVar8 = (PolyNf *)0x0;
      }
      else {
        in_stack_fffffffffffffda0 =
             Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
             operator*((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x918426);
        pSVar7 = Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                               *)0x91843a);
        sVar6 = Stack<Kernel::TermList>::size(pSVar7);
        in_stack_fffffffffffffd8c = BottomUpChildIter<Kernel::PolyNf>::nChildren(&local_14c);
        in_stack_fffffffffffffd80 =
             (PolyNf *)
             Stack<Kernel::TermList>::operator[]
                       (in_stack_fffffffffffffda0,sVar6 - in_stack_fffffffffffffd8c);
        pPVar8 = in_stack_fffffffffffffd80;
      }
      local_158 = pPVar8;
      BottomUpChildIter<Kernel::PolyNf>::self(&local_180,&local_14c);
      in_stack_fffffffffffffd30._content = (uint64_t)&local_14c;
      in_stack_fffffffffffffd38 = (ReturnNone<Kernel::TermList> *)&local_158;
      init.orig = (BottomUpChildIter<Kernel::PolyNf> *)pPVar8;
      init.this = (BottomUpEvaluation<Kernel::PolyNf,_Kernel::TermList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_PolynomialNormalizer_cpp:393:9),_Lib::ReturnNone<Kernel::TermList>,_MemoNonVars<Kernel::PolyNf,_Kernel::TermList>_&,_std::tuple<>_>
                   *)in_stack_fffffffffffffda0;
      init.argLst._0_4_ = in_stack_fffffffffffffdb0;
      init.argLst._4_4_ = uVar2;
      in_stack_fffffffffffffd28 = in_RDI;
      in_stack_fffffffffffffd70 =
           MemoNonVars<Kernel::PolyNf,Kernel::TermList>::
           getOrInit<Lib::BottomUpEvaluation<Kernel::PolyNf,Kernel::TermList,Kernel::PolyNf::denormalize()const::__0,Lib::ReturnNone<Kernel::TermList>,MemoNonVars<Kernel::PolyNf,Kernel::TermList>&,std::tuple<>>::apply(Kernel::PolyNf_const&)::_lambda()_1_>
                     ((MemoNonVars<Kernel::PolyNf,_Kernel::TermList> *)
                      CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                      in_stack_fffffffffffffd80,init);
      local_180._self._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>_>
      .
      super_RawCoproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,_Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
      ._content._23_8_ = in_stack_fffffffffffffd70;
      Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x918548);
      BottomUpChildIter<Kernel::PolyNf>::nChildren(&local_14c);
      Stack<Kernel::TermList>::pop
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffd40,
                 (uint)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x91857f);
      Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
    }
  }
  pSVar7 = Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
           operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x9185be);
  local_8 = (uint64_t)Stack<Kernel::TermList>::pop(pSVar7);
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            ((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffd70._content);
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffffd70._content);
  return (TermList)local_8;
}

Assistant:

Result apply(Arg const& toEval) 
  {
    /* recursion state. Contains a stack of items that are being recursed on. */
    Recycled<Stack<BottomUpChildIter<Arg>>> recState;
    Recycled<Stack<Result>> recResults;

    recState->push(BottomUpChildIter<Arg>(toEval, _context));

    while (!recState->isEmpty()) {
      if (recState->top().hasNext(_context)) {
        Arg t = recState->top().next(_context);

        Option<Result> nonRec = _evNonRec(t);
        if (nonRec) {
          recResults->push(move_if_value<Result>(*nonRec));

        } else {
          Option<Result> cached = _memo.get(t);
          if (cached.isSome()) {
            recResults->push(std::move(cached).unwrap());
          } else {
            recState->push(BottomUpChildIter<Arg>(t, _context));
          }

        }

      } else {

        BottomUpChildIter<Arg> orig = recState->pop();

        ASS_GE(recResults.size(), orig.nChildren(_context))
        Result* argLst = orig.nChildren(_context) == 0 
          ? nullptr 
          : static_cast<Result*>(&((*recResults)[recResults->size() - orig.nChildren(_context)]));

        Result eval = _memo.getOrInit(orig.self(), 
                        [&](){ return _function(orig.self(), argLst); });

        DEBUG_BOTTOM_UP(0, "evaluated: ", orig.self(), " -> ", eval);
        recResults->pop(orig.nChildren(_context));
        recResults->push(std::move(eval));
      }
    }
    ASS(recState->isEmpty())


    ASS(recResults->size() == 1);
    auto result = recResults->pop();
    DEBUG_BOTTOM_UP(0, "eval result: ", toEval, " -> ", result);
    return result;
  }